

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall ValidateFootprint::StoreLine(ValidateFootprint *this)

{
  size_t sVar1;
  ValidateFootprint *this_local;
  
  (this->super_Validate).lineno_ = (this->super_Validate).lineno_ + 1;
  this->prevEventID_ = (this->fr_).event_id;
  this->prevAreaPerilID_ = (this->fr_).super_EventRow.areaperil_id;
  sVar1 = strlen((this->super_Validate).line_);
  memcpy(this->prevLine_,&this->super_Validate,sVar1 + 1);
  sVar1 = strlen((this->super_Validate).line_);
  this->prevLine_[sVar1 - 1] = '\0';
  return;
}

Assistant:

inline void ValidateFootprint::StoreLine() {
/* Store current line before going to the next one. Used in some error message
 * output. */

    ++lineno_;
    prevEventID_ = fr_.event_id;
    prevAreaPerilID_ = fr_.areaperil_id;

    memcpy(prevLine_, line_, strlen(line_) + 1);
    prevLine_[strlen(line_) - 1] = '\0';

}